

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

string * __thiscall amrex::ParmParse::getPrefix_abi_cxx11_(ParmParse *this)

{
  const_reference pvVar1;
  string *in_RDI;
  
  pvVar1 = std::
           stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::top((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x11a45b5);
  std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
  return in_RDI;
}

Assistant:

std::string
ParmParse::getPrefix() const
{
    return m_pstack.top();
}